

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall CServer::SendMap(CServer *this,int ClientID)

{
  char *pStr;
  long in_FS_OFFSET;
  CMsgPacker Msg;
  CPacker CStack_838;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CPacker::Reset(&CStack_838);
  CPacker::AddInt(&CStack_838,5);
  pStr = GetMapName(this);
  CPacker::AddString(&CStack_838,pStr,0);
  CPacker::AddInt(&CStack_838,this->m_CurrentMapCrc);
  CPacker::AddInt(&CStack_838,this->m_CurrentMapSize);
  CPacker::AddInt(&CStack_838,this->m_MapChunksPerRequest);
  CPacker::AddInt(&CStack_838,0x568);
  CPacker::AddRaw(&CStack_838,&this->m_CurrentMapSha256,0x20);
  (*(this->super_IServer).super_IInterface._vptr_IInterface[9])(this,&CStack_838,3,ClientID);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServer::SendMap(int ClientID)
{
	CMsgPacker Msg(NETMSG_MAP_CHANGE, true);
	Msg.AddString(GetMapName(), 0);
	Msg.AddInt(m_CurrentMapCrc);
	Msg.AddInt(m_CurrentMapSize);
	Msg.AddInt(m_MapChunksPerRequest);
	Msg.AddInt(MAP_CHUNK_SIZE);
	Msg.AddRaw(&m_CurrentMapSha256, sizeof(m_CurrentMapSha256));
	SendMsg(&Msg, MSGFLAG_VITAL|MSGFLAG_FLUSH, ClientID);
}